

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading_atomic_ref_count.h
# Opt level: O0

void threading_atomic_ref_count_initialize(threading_atomic_ref_count ref)

{
  threading_atomic_ref_count in_RDI;
  
  threading_atomic_ref_count_store(in_RDI,0);
  return;
}

Assistant:

static inline void threading_atomic_ref_count_initialize(threading_atomic_ref_count ref)
{
#if defined(__THREAD_SANITIZER__)
	uintmax_t init = THREADING_ATOMIC_REF_COUNT_MIN;

	threading_mutex_initialize(&ref->m);

	threading_mutex_store(&ref->m, &ref->count, &init, sizeof(uintmax_t));
#else
	threading_atomic_ref_count_store(ref, THREADING_ATOMIC_REF_COUNT_MIN);
#endif
}